

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool ON_Extrusion::CleanupPolyCurveProfile(ON_PolyCurve *polycurve)

{
  bool bVar1;
  uint i;
  int iVar2;
  ON_Curve *pOVar3;
  ON_PolyCurve *this;
  uint uVar4;
  long lVar5;
  ON_PolyCurve *new_segment;
  ON_Curve *old_segment;
  ON_SimpleArray<ON_PolyCurve_*> new_polycurves;
  ON_PolyCurve *local_50;
  ON_SimpleArray<ON_Curve_*> new_segments;
  
  bVar1 = IsValidPolyCurveProfile(polycurve,(ON_TextLog *)0x0);
  if (bVar1) {
    (*(polycurve->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x28])
              (polycurve,2);
  }
  else {
    i = ON_PolyCurve::Count(polycurve);
    uVar4 = 0;
    if ((int)i < 2) goto LAB_003ee2bd;
    for (; i != uVar4; uVar4 = uVar4 + 1) {
      pOVar3 = ON_PolyCurve::SegmentCurve(polycurve,uVar4);
      if ((pOVar3 == (ON_Curve *)0x0) ||
         ((iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x18])(pOVar3),
          iVar2 != 2 &&
          (iVar2 = (*(pOVar3->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(pOVar3,2),
          (char)iVar2 == '\0')))) goto LAB_003ee2ba;
    }
    ON_PolyCurve::SynchronizeSegmentDomains(polycurve);
    ON_SimpleArray<ON_PolyCurve_*>::ON_SimpleArray(&new_polycurves,(ulong)i);
    ON_SimpleArray<ON_Curve_*>::ON_SimpleArray(&new_segments,(ulong)i);
    new_segment = (ON_PolyCurve *)0x0;
    for (uVar4 = 0; i != uVar4; uVar4 = uVar4 + 1) {
      old_segment = ON_PolyCurve::SegmentCurve(polycurve,uVar4);
      iVar2 = (*(old_segment->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(old_segment)
      ;
      if ((char)iVar2 == '\0') {
        if (new_segment == (ON_PolyCurve *)0x0) {
          this = (ON_PolyCurve *)operator_new(0x40);
          ON_PolyCurve::ON_PolyCurve(this);
          new_segment = this;
          ON_SimpleArray<ON_PolyCurve_*>::Append(&new_polycurves,&new_segment);
          ON_PolyCurve::Append(new_segment,old_segment);
        }
        else {
          ON_PolyCurve::Append(new_segment,old_segment);
          iVar2 = ON_PolyCurve::FindNextGap(new_segment,0);
          if (iVar2 != 0) goto LAB_003ee1e2;
          iVar2 = (*(new_segment->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                    [0x34])();
          if ((char)iVar2 != '\0') {
            local_50 = new_segment;
            ON_SimpleArray<ON_Curve_*>::Append(&new_segments,(ON_Curve **)&local_50);
            new_segment = (ON_PolyCurve *)0x0;
          }
        }
      }
      else {
        if (new_segment != (ON_PolyCurve *)0x0) {
LAB_003ee1e2:
          bVar1 = (int)i <= (int)uVar4;
          goto LAB_003ee1e8;
        }
        ON_SimpleArray<ON_Curve_*>::Append(&new_segments,&old_segment);
      }
    }
    bVar1 = true;
LAB_003ee1e8:
    lVar5 = 0;
    bVar1 = (bool)(new_segment == (ON_PolyCurve *)0x0 & bVar1);
    if (bVar1) {
      for (; lVar5 < new_polycurves.m_count; lVar5 = lVar5 + 1) {
        ON_PolyCurve::RemoveNesting(new_polycurves.m_a[lVar5]);
      }
      while (0 < (int)i) {
        i = i - 1;
        ON_PolyCurve::HarvestSegment(polycurve,i);
        ON_PolyCurve::Remove(polycurve,i);
      }
      for (lVar5 = 0; lVar5 < new_segments.m_count; lVar5 = lVar5 + 1) {
        ON_PolyCurve::Append(polycurve,new_segments.m_a[lVar5]);
      }
    }
    else {
      for (; lVar5 < new_polycurves.m_count; lVar5 = lVar5 + 1) {
        new_segment = new_polycurves.m_a[lVar5];
        if (new_segment != (ON_PolyCurve *)0x0) {
          iVar2 = ON_PolyCurve::Count(new_segment);
          while (0 < iVar2) {
            iVar2 = iVar2 + -1;
            ON_PolyCurve::HarvestSegment(new_segment,iVar2);
          }
          if (new_segment != (ON_PolyCurve *)0x0) {
            (*(new_segment->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[4])();
          }
        }
      }
    }
    ON_SimpleArray<ON_Curve_*>::~ON_SimpleArray(&new_segments);
    ON_SimpleArray<ON_PolyCurve_*>::~ON_SimpleArray(&new_polycurves);
    if (!bVar1) {
LAB_003ee2ba:
      uVar4 = 0;
      goto LAB_003ee2bd;
    }
  }
  uVar4 = 1;
LAB_003ee2bd:
  return SUB41(uVar4,0);
}

Assistant:

bool ON_Extrusion::CleanupPolyCurveProfile( ON_PolyCurve& polycurve )
{
  if ( !ON_Extrusion::IsValidPolyCurveProfile(polycurve) )
  {
    // see if we can fix it
    int i;
    const int old_count = polycurve.Count();
    if ( old_count <= 1 )
      return false;

    // make segments 2d 
    for ( i = 0; i < old_count; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( 0 == old_segment )
        return false;
      if ( 2 != old_segment->Dimension() && !old_segment->ChangeDimension(2) )
        return false;
    }

    // make segment domains match the polycurve's m_t[] array
    polycurve.SynchronizeSegmentDomains();

    // make each segment a closed curve
    ON_SimpleArray<ON_PolyCurve*> new_polycurves(old_count);
    ON_SimpleArray<ON_Curve*> new_segments(old_count);
    ON_PolyCurve* new_segment = 0;
    bool rc = true;
    for ( i = 0; i < old_count && rc; i++ )
    {
      ON_Curve* old_segment = polycurve.SegmentCurve(i);
      if ( old_segment->IsClosed() )
      {
        if ( 0 != new_segment )
        {
          rc = false;
          break;
        }
        new_segments.Append(old_segment);
      }
      else if ( 0 == new_segment )
      {
        new_segment = new ON_PolyCurve();
        new_polycurves.Append(new_segment);
        new_segment->Append(old_segment);
      }
      else
      {
        new_segment->Append(old_segment);
        if ( new_segment->FindNextGap(0) )
        {
          rc = false;
          break;
        }
        if ( new_segment->IsClosed() )
        {
          new_segments.Append(new_segment);
          new_segment = 0;
        }
      }
    }

    if ( 0 != new_segment )
    {
      rc = false;
    }

    if ( !rc )
    {
      // unable to fix polycurve. Delete the new stuff we allocated.
      for ( i = 0; i < new_polycurves.Count(); i++ )
      {
        new_segment = new_polycurves[i];
        if ( new_segment )
        {
          for ( int j =  new_segment->Count()-1; j >= 0; j-- )
          {
            new_segment->HarvestSegment(j); // do not delete parts of input polycurve
          }
          delete new_segment;
        }
      }
      return false;
    }

    for ( i = 0; i < new_polycurves.Count(); i++ )
    {
      new_polycurves[i]->RemoveNesting();
    }

    for ( i = old_count-1; i >= 0; i-- )
    {
      polycurve.HarvestSegment(i);
      polycurve.Remove(i);
    }
    for ( i = 0; i < new_segments.Count(); i++ )
    {
      polycurve.Append(new_segments[i]);
    }
  }
  else
  {
    polycurve.ChangeDimension(2);
  }
  return true;
}